

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::readFromBinary(Binasc *this,ostream *out,istream *input)

{
  int local_24;
  int status;
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  if (this->m_midiQ == 0) {
    if (this->m_bytesQ == 0) {
      local_24 = outputStyleAscii(this,out,input);
    }
    else if ((this->m_bytesQ == 0) || (this->m_commentsQ == 0)) {
      local_24 = outputStyleBinary(this,out,input);
    }
    else {
      local_24 = outputStyleBoth(this,out,input);
    }
  }
  else {
    local_24 = outputStyleMidi(this,out,input);
  }
  return local_24;
}

Assistant:

int Binasc::readFromBinary(std::ostream& out, std::istream& input) {
	int status;
	if (m_midiQ) {
		status = outputStyleMidi(out, input);
	} else if (!m_bytesQ) {
		status = outputStyleAscii(out, input);
	} else if (m_bytesQ && m_commentsQ) {
		status = outputStyleBoth(out, input);
	} else {
		status = outputStyleBinary(out, input);
	}
	return status;
}